

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenDefaultConstructor(CppGenerator *this,StructDef *struct_def)

{
  CodeWriter *pCVar1;
  SymbolTable<flatbuffers::Value> *this_00;
  BaseType BVar2;
  FieldDef *field;
  bool bVar3;
  Value *pVVar4;
  Value *pVVar5;
  string *psVar6;
  pointer ppFVar7;
  string initializer_list;
  string local_118;
  string local_f8;
  CodeWriter *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&initializer_list,"NATIVE_NAME",(allocator<char> *)&local_d0);
  EscapeKeyword(&local_f8,this,(string *)struct_def);
  NativeName(&local_118,&local_f8,struct_def,&(this->opts_).super_IDLOptions);
  pCVar1 = &this->code_;
  CodeWriter::SetValue(pCVar1,&initializer_list,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&initializer_list);
  if (*(int *)&(this->opts_).super_IDLOptions.field_0x30c < 1) {
    initializer_list._M_dataplus._M_p = (pointer)&initializer_list.field_2;
    initializer_list._M_string_length = 0;
    initializer_list.field_2._M_local_buf[0] = '\0';
    local_d8 = pCVar1;
    for (ppFVar7 = (struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; pCVar1 = local_d8,
        ppFVar7 !=
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppFVar7 = ppFVar7 + 1) {
      field = *ppFVar7;
      if ((field->deprecated != false) || ((field->value).type.base_type == BASE_TYPE_UTYPE))
      goto LAB_0016a3ab;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"cpp_type",(allocator<char> *)&local_f8);
      this_00 = &(field->super_Definition).attributes;
      pVVar4 = SymbolTable<flatbuffers::Value>::Lookup(this_00,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"native_default",(allocator<char> *)&local_f8);
      pVVar5 = SymbolTable<flatbuffers::Value>::Lookup(this_00,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      BVar2 = (field->value).type.base_type;
      if (BVar2 - BASE_TYPE_UTYPE < 0xc) {
        if (initializer_list._M_string_length != 0) {
          std::__cxx11::string::append((char *)&initializer_list);
        }
        Name_abi_cxx11_(&local_118,this,field);
        std::__cxx11::string::append((string *)&initializer_list);
        std::__cxx11::string::~string((string *)&local_118);
        if (pVVar5 == (Value *)0x0) {
          GetDefaultScalarValue_abi_cxx11_(&local_d0,this,field,true);
        }
        else {
          std::__cxx11::string::string((string *)&local_d0,(string *)&pVVar5->constant);
        }
        std::operator+(&local_f8,"(",&local_d0);
        std::operator+(&local_118,&local_f8,")");
        std::__cxx11::string::append((string *)&initializer_list);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_f8);
        psVar6 = &local_d0;
LAB_0016a3a6:
        std::__cxx11::string::~string((string *)psVar6);
      }
      else if (BVar2 == BASE_TYPE_STRUCT) {
        if ((pVVar5 != (Value *)0x0) && (((field->value).type.struct_def)->fixed != false)) {
          if (initializer_list._M_string_length != 0) {
            std::__cxx11::string::append((char *)&initializer_list);
          }
          Name_abi_cxx11_(&local_70,this,field);
          std::operator+(&local_d0,&local_70,"(");
          std::operator+(&local_f8,&local_d0,&pVVar5->constant);
          std::operator+(&local_118,&local_f8,")");
          std::__cxx11::string::append((string *)&initializer_list);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_d0);
          psVar6 = &local_70;
          goto LAB_0016a3a6;
        }
      }
      else if (((pVVar4 != (Value *)0x0) && (BVar2 != BASE_TYPE_VECTOR)) &&
              (BVar2 != BASE_TYPE_VECTOR64)) {
        if (initializer_list._M_string_length != 0) {
          std::__cxx11::string::append((char *)&initializer_list);
        }
        Name_abi_cxx11_(&local_f8,this,field);
        std::operator+(&local_118,&local_f8,"(0)");
        std::__cxx11::string::append((string *)&initializer_list);
        std::__cxx11::string::~string((string *)&local_118);
        psVar6 = &local_f8;
        goto LAB_0016a3a6;
      }
LAB_0016a3ab:
    }
    if (initializer_list._M_string_length != 0) {
      std::operator+(&local_118,"\n      : ",&initializer_list);
      std::__cxx11::string::operator=((string *)&initializer_list,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"INIT_LIST",(allocator<char> *)&local_f8);
    CodeWriter::SetValue(pCVar1,&local_118,&initializer_list);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"  {{NATIVE_NAME}}(){{INIT_LIST}} {",
               (allocator<char> *)&local_118);
    CodeWriter::operator+=(pCVar1,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"  }",(allocator<char> *)&local_118);
    CodeWriter::operator+=(pCVar1,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    psVar6 = &initializer_list;
  }
  else {
    bVar3 = NeedsCopyCtorAssignOp(this,struct_def);
    if (!bVar3) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"  {{NATIVE_NAME}}() = default;",
               (allocator<char> *)&initializer_list);
    CodeWriter::operator+=(pCVar1,&local_50);
    psVar6 = &local_50;
  }
  std::__cxx11::string::~string((string *)psVar6);
  return;
}

Assistant:

void GenDefaultConstructor(const StructDef &struct_def) {
    code_.SetValue("NATIVE_NAME",
                   NativeName(Name(struct_def), &struct_def, opts_));
    // In >= C++11, default member initializers are generated. To allow for
    // aggregate initialization, do not emit a default constructor at all, with
    // the exception of types that need a copy/move ctors and assignment
    // operators.
    if (opts_.g_cpp_std >= cpp::CPP_STD_11) {
      if (NeedsCopyCtorAssignOp(struct_def)) {
        code_ += "  {{NATIVE_NAME}}() = default;";
      }
      return;
    }
    std::string initializer_list;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (!field.deprecated &&  // Deprecated fields won't be accessible.
          field.value.type.base_type != BASE_TYPE_UTYPE) {
        auto cpp_type = field.attributes.Lookup("cpp_type");
        auto native_default = field.attributes.Lookup("native_default");
        // Scalar types get parsed defaults, raw pointers get nullptrs.
        if (IsScalar(field.value.type.base_type)) {
          if (!initializer_list.empty()) { initializer_list += ",\n        "; }
          initializer_list += Name(field);
          initializer_list +=
              "(" +
              (native_default ? std::string(native_default->constant)
                              : GetDefaultScalarValue(field, true)) +
              ")";
        } else if (field.value.type.base_type == BASE_TYPE_STRUCT) {
          if (IsStruct(field.value.type)) {
            if (native_default) {
              if (!initializer_list.empty()) {
                initializer_list += ",\n        ";
              }
              initializer_list +=
                  Name(field) + "(" + native_default->constant + ")";
            }
          }
        } else if (cpp_type && !IsVector(field.value.type)) {
          if (!initializer_list.empty()) { initializer_list += ",\n        "; }
          initializer_list += Name(field) + "(0)";
        }
      }
    }
    if (!initializer_list.empty()) {
      initializer_list = "\n      : " + initializer_list;
    }

    code_.SetValue("INIT_LIST", initializer_list);

    code_ += "  {{NATIVE_NAME}}(){{INIT_LIST}} {";
    code_ += "  }";
  }